

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

QString * __thiscall
QInputDialogPrivate::listViewText(QString *__return_storage_ptr__,QInputDialogPrivate *this)

{
  char cVar1;
  int index;
  long in_FS_OFFSET;
  QArrayData *local_40;
  int *local_38;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::selectionModel((QAbstractItemView *)this->listView);
  cVar1 = QItemSelectionModel::hasSelection();
  if (cVar1 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_004fe7c5;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QAbstractItemView::selectionModel((QAbstractItemView *)this->listView);
    QItemSelectionModel::selectedRows((int)&local_40);
    if (local_30 == 0) {
      index = -1;
    }
    else {
      index = *local_38;
    }
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,0x18,0x10);
      }
    }
    QComboBox::itemText(__return_storage_ptr__,this->comboBox,index);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_004fe7c5:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QInputDialogPrivate::listViewText() const
{
    if (listView->selectionModel()->hasSelection()) {
        int row = listView->selectionModel()->selectedRows().value(0).row();
        return comboBox->itemText(row);
    } else {
        return QString();
    }
}